

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt,int extra)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((ctxt != (xmlSaveCtxtPtr)0x0) && (ctxt->buf != (xmlOutputBufferPtr)0x0)) {
    xmlOutputBufferWrite(ctxt->buf,1,"\n");
    iVar2 = ctxt->level + extra;
    if (iVar2 != 0 && SCARRY4(ctxt->level,extra) == iVar2 < 0) {
      iVar1 = 0;
      do {
        iVar3 = iVar2 - iVar1;
        if (ctxt->indent_nr <= iVar2 - iVar1) {
          iVar3 = ctxt->indent_nr;
        }
        xmlOutputBufferWrite(ctxt->buf,iVar3 * ctxt->indent_size,ctxt->indent);
        iVar1 = iVar1 + ctxt->indent_nr;
        iVar2 = ctxt->level + extra;
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

static void
xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt, int extra)
{
    int i;
    if ((ctxt == NULL) || (ctxt->buf == NULL))
        return;
    xmlOutputBufferWrite(ctxt->buf, 1, "\n");
    for (i = 0; i < (ctxt->level + extra); i += ctxt->indent_nr) {
        xmlOutputBufferWrite(ctxt->buf, ctxt->indent_size *
                ((ctxt->level + extra - i) > ctxt->indent_nr ?
                 ctxt->indent_nr : (ctxt->level + extra - i)),
                ctxt->indent);
    }
}